

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O0

void search(int k,DancingNode *header,
           vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *solutions,
           vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
           *Matrix,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *grid)

{
  DancingNode *local_50;
  DancingNode *column;
  DancingNode *leftNode;
  DancingNode *rightNode;
  DancingNode *rowNode;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *grid_local;
  vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
  *Matrix_local;
  vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *solutions_local;
  DancingNode *header_local;
  int k_local;
  
  rowNode = (DancingNode *)grid;
  grid_local = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)Matrix;
  Matrix_local = (vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                  *)solutions;
  solutions_local = (vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *)header;
  header_local._4_4_ = k;
  if (header->right == header) {
    printSolutions(solutions,grid);
  }
  else {
    local_50 = getMinColumn(header);
    cover(local_50,(vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                    *)grid_local);
    for (rightNode = local_50->down; rightNode != local_50; rightNode = rightNode->down) {
      std::vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>::push_back
                ((vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *)Matrix_local,
                 &rightNode);
      for (leftNode = rightNode->right; leftNode != rightNode; leftNode = leftNode->right) {
        cover(leftNode,(vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                        *)grid_local);
      }
      search(header_local._4_4_ + 1,(DancingNode *)solutions_local,
             (vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *)Matrix_local,
             (vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
              *)grid_local,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)rowNode);
      std::vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>::pop_back
                ((vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *)Matrix_local);
      local_50 = rightNode->column;
      for (column = rightNode->left; column != rightNode; column = column->left) {
        uncover(column,(vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                        *)grid_local);
      }
    }
    uncover(local_50,(vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                      *)grid_local);
  }
  return;
}

Assistant:

void search(int k, DancingNode *header, vector<DancingNode*> &solutions, vector<vector<DancingNode>> &Matrix, vector<vector<int>> &grid) 
{ 
    DancingNode *rowNode; 
    DancingNode *rightNode; 
    DancingNode *leftNode; 
    DancingNode *column; 
    //cout<<"IN"<<endl; 
    // if no column left, then we must 
    // have found the solution 
    if(header->right == header) 
    {
        //cout << "OUT" << endl; 
        printSolutions(solutions, grid); 
        return; 
    } 
  
    // choose column deterministically 
    column = getMinColumn(header); 
    //cout << "COVERING" <<endl; 
    // cover chosen column 
    cover(column, Matrix); 
  
    for(rowNode = column->down; rowNode != column;  
        rowNode = rowNode->down ) 
    {
        //cout << "hey u" << endl; 
        solutions.push_back(rowNode); 
  
        for(rightNode = rowNode->right; rightNode != rowNode; 
            rightNode = rightNode->right) 
            cover(rightNode, Matrix); 
  
        // move to level k+1 (recursively) 
        search(k+1, header, solutions, Matrix, grid); 
  
        // if solution in not possible, backtrack (uncover) 
        // and remove the selected row (set) from solution 
        solutions.pop_back(); 
  
        column = rowNode->column; 
        for(leftNode = rowNode->left; leftNode != rowNode; 
            leftNode = leftNode->left) 
            uncover(leftNode, Matrix); 
    } 
  
    uncover(column, Matrix); 
}